

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

GLenum __thiscall
gl4cts::DirectStateAccess::Textures::CreationErrorsTest::NotATarget(CreationErrorsTest *this)

{
  bool bVar1;
  uint local_1c;
  GLuint i;
  bool is_target;
  GLenum not_a_target;
  CreationErrorsTest *this_local;
  
  i = 0;
  bVar1 = true;
  do {
    if (!bVar1) {
      return i;
    }
    i = i + 1;
    bVar1 = false;
    for (local_1c = 0; local_1c < 0xb; local_1c = local_1c + 1) {
      if (NotATarget::texture_targets[local_1c] == i) {
        bVar1 = true;
        break;
      }
    }
  } while( true );
}

Assistant:

glw::GLenum CreationErrorsTest::NotATarget()
{
	static const glw::GLenum texture_targets[] = { GL_TEXTURE_1D,
												   GL_TEXTURE_2D,
												   GL_TEXTURE_3D,
												   GL_TEXTURE_1D_ARRAY,
												   GL_TEXTURE_2D_ARRAY,
												   GL_TEXTURE_RECTANGLE,
												   GL_TEXTURE_CUBE_MAP,
												   GL_TEXTURE_CUBE_MAP_ARRAY,
												   GL_TEXTURE_BUFFER,
												   GL_TEXTURE_2D_MULTISAMPLE,
												   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };

	glw::GLenum not_a_target = 0;
	bool		is_target	= true;

	while (is_target)
	{
		not_a_target++;

		is_target = false;

		for (glw::GLuint i = 0; i < sizeof(texture_targets) / sizeof(texture_targets[0]); ++i)
		{
			if (texture_targets[i] == not_a_target)
			{
				is_target = true;
				break;
			}
		}
	}

	return not_a_target;
}